

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

int32_t secp256k1_modinv32_divsteps_30_var
                  (int32_t eta,uint32_t f0,uint32_t g0,secp256k1_modinv32_trans2x2 *t)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  int *in_RCX;
  uint in_EDX;
  uint in_ESI;
  int in_EDI;
  uint32_t tmp;
  int zeros;
  int limit;
  int i;
  uint16_t w;
  uint32_t m;
  uint32_t g;
  uint32_t f;
  uint32_t r;
  uint32_t q;
  uint32_t v;
  uint32_t u;
  int local_4c;
  int local_3c;
  uint local_30;
  uint local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_4;
  
  local_1c = 1;
  local_20 = 0;
  local_24 = 0;
  local_28 = 1;
  local_3c = 0x1e;
  local_30 = in_EDX;
  local_2c = in_ESI;
  local_4 = in_EDI;
  while( true ) {
    iVar2 = secp256k1_ctz32_var(local_30 | -1 << ((byte)local_3c & 0x1f));
    bVar6 = (byte)iVar2;
    uVar3 = local_30 >> (bVar6 & 0x1f);
    iVar4 = local_1c << (bVar6 & 0x1f);
    iVar5 = local_20 << (bVar6 & 0x1f);
    local_4 = local_4 - iVar2;
    local_3c = local_3c - iVar2;
    if (local_3c == 0) break;
    local_30 = uVar3;
    local_20 = iVar5;
    local_1c = iVar4;
    if (local_4 < 0) {
      local_4 = -local_4;
      local_30 = -local_2c;
      local_1c = local_24;
      local_24 = -iVar4;
      local_20 = local_28;
      local_28 = -iVar5;
      local_2c = uVar3;
    }
    local_4c = local_3c;
    if (local_4 + 1 <= local_3c) {
      local_4c = local_4 + 1;
    }
    uVar1 = (short)local_30 * (ushort)secp256k1_modinv32_inv256[local_2c >> 1 & 0x7f] &
            (ushort)(0xffffffff >> (0x20U - (char)local_4c & 0x1f)) & 0xff;
    local_30 = local_2c * uVar1 + local_30;
    local_24 = local_1c * (uint)uVar1 + local_24;
    local_28 = local_20 * (uint)uVar1 + local_28;
  }
  *in_RCX = iVar4;
  in_RCX[1] = iVar5;
  in_RCX[2] = local_24;
  in_RCX[3] = local_28;
  return local_4;
}

Assistant:

static int32_t secp256k1_modinv32_divsteps_30_var(int32_t eta, uint32_t f0, uint32_t g0, secp256k1_modinv32_trans2x2 *t) {
    /* Transformation matrix; see comments in secp256k1_modinv32_divsteps_30. */
    uint32_t u = 1, v = 0, q = 0, r = 1;
    uint32_t f = f0, g = g0, m;
    uint16_t w;
    int i = 30, limit, zeros;

    for (;;) {
        /* Use a sentinel bit to count zeros only up to i. */
        zeros = secp256k1_ctz32_var(g | (UINT32_MAX << i));
        /* Perform zeros divsteps at once; they all just divide g by two. */
        g >>= zeros;
        u <<= zeros;
        v <<= zeros;
        eta -= zeros;
        i -= zeros;
         /* We're done once we've done 30 divsteps. */
        if (i == 0) break;
        VERIFY_CHECK((f & 1) == 1);
        VERIFY_CHECK((g & 1) == 1);
        VERIFY_CHECK((u * f0 + v * g0) == f << (30 - i));
        VERIFY_CHECK((q * f0 + r * g0) == g << (30 - i));
        /* Bounds on eta that follow from the bounds on iteration count (max 25*30 divsteps). */
        VERIFY_CHECK(eta >= -751 && eta <= 751);
        /* If eta is negative, negate it and replace f,g with g,-f. */
        if (eta < 0) {
            uint32_t tmp;
            eta = -eta;
            tmp = f; f = g; g = -tmp;
            tmp = u; u = q; q = -tmp;
            tmp = v; v = r; r = -tmp;
        }
        /* eta is now >= 0. In what follows we're going to cancel out the bottom bits of g. No more
         * than i can be cancelled out (as we'd be done before that point), and no more than eta+1
         * can be done as its sign will flip once that happens. */
        limit = ((int)eta + 1) > i ? i : ((int)eta + 1);
        /* m is a mask for the bottom min(limit, 8) bits (our table only supports 8 bits). */
        VERIFY_CHECK(limit > 0 && limit <= 30);
        m = (UINT32_MAX >> (32 - limit)) & 255U;
        /* Find what multiple of f must be added to g to cancel its bottom min(limit, 8) bits. */
        w = (g * secp256k1_modinv32_inv256[(f >> 1) & 127]) & m;
        /* Do so. */
        g += f * w;
        q += u * w;
        r += v * w;
        VERIFY_CHECK((g & m) == 0);
    }
    /* Return data in t and return value. */
    t->u = (int32_t)u;
    t->v = (int32_t)v;
    t->q = (int32_t)q;
    t->r = (int32_t)r;
    /* The determinant of t must be a power of two. This guarantees that multiplication with t
     * does not change the gcd of f and g, apart from adding a power-of-2 factor to it (which
     * will be divided out again). As each divstep's individual matrix has determinant 2, the
     * aggregate of 30 of them will have determinant 2^30. */
    VERIFY_CHECK((int64_t)t->u * t->r - (int64_t)t->v * t->q == ((int64_t)1) << 30);
    return eta;
}